

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O0

Slice * __thiscall Imf_2_5::SampleCountChannel::slice(SampleCountChannel *this)

{
  ImageLevel *b;
  int iVar1;
  int xsm;
  int ysm;
  ImageChannel *in_RSI;
  Slice *in_RDI;
  
  b = in_RSI[1]._level;
  iVar1 = ImageChannel::pixelsPerRow(in_RSI);
  xsm = ImageChannel::xSampling(in_RSI);
  ysm = ImageChannel::ySampling(in_RSI);
  Slice::Slice(in_RDI,UINT,(char *)b,4,(long)iVar1 << 2,xsm,ysm,0.0,false,false);
  return in_RDI;
}

Assistant:

Slice
SampleCountChannel::slice () const
{
    return Slice (UINT,                                     // type
                  (char *) _base,                           // base
                  sizeof (unsigned int),                    // xStride
                  pixelsPerRow() * sizeof (unsigned int),   // yStride
                  xSampling(),
                  ySampling());
}